

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase312::run(TestCase312 *this)

{
  byte *pbVar1;
  _func_int ***ppp_Var2;
  _func_int ***ppp_Var3;
  long *plVar4;
  ClientHook *pCVar5;
  undefined8 uVar6;
  Disposer *pDVar7;
  WirePointer *pWVar8;
  Connection CVar9;
  PromiseNode *pPVar10;
  void *pvVar11;
  int iVar12;
  undefined4 uVar13;
  undefined8 *puVar14;
  char *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar15;
  Own<capnp::ClientHook> OVar16;
  Client CVar17;
  Reader RVar18;
  Own<kj::NetworkAddress> address;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Own<kj::ConnectionReceiver> listener;
  Own<kj::AsyncIoStream> connection;
  Promise<void> listenPromise;
  Client cap;
  AsyncIoContext ioContext;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  TwoPartyServer server;
  TwoPartyClient client;
  Promise<kj::Own<kj::NetworkAddress>_> local_358;
  int local_344;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_340;
  void *local_328;
  short local_31c;
  undefined4 local_318;
  undefined8 *local_310;
  long *local_308;
  undefined8 *local_300;
  long *local_2f8;
  Promise<kj::Own<kj::AsyncIoStream>_> local_2f0;
  Client local_2e0;
  undefined1 local_2d0 [24];
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  Disposer *pDStack_2b0;
  Task *local_2a8;
  Disposer *local_2a0;
  PromiseFulfiller<void> *local_298;
  long *local_290;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_278;
  undefined1 local_240 [64];
  undefined8 *local_200;
  long *local_1f8;
  TaskSet local_1f0;
  TwoPartyClient local_1c8;
  ArrayPtr<const_char> local_38;
  Maybe<capnp::MessageSize> local_28;
  
  kj::setupAsyncIo();
  local_344 = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_340,&local_344);
  local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase._4_4_ =
       local_340.super_PromiseBase.node.disposer._4_4_;
  local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase._0_4_ =
       local_340.super_PromiseBase.node.disposer._0_4_;
  local_1c8.network.super_Connection.super_Connection._vptr_Connection =
       (Connection)(local_340.super_PromiseBase.node.ptr + 2);
  if (local_340.super_PromiseBase.node.ptr == (PromiseNode *)0x0) {
    local_1c8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
  }
  local_340.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  OVar16 = Capability::Client::makeLocalClient
                     (&local_2e0,(Own<capnp::Capability::Server> *)&local_1c8);
  CVar9.super_Connection._vptr_Connection =
       local_1c8.network.super_Connection.super_Connection._vptr_Connection;
  if (local_1c8.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_1c8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (*(code *)**(undefined8 **)
                local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                _vptr_VatNetworkBase)
              (local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (long)CVar9.super_Connection._vptr_Connection +
               *(long *)(*(long *)CVar9.super_Connection._vptr_Connection + -0x10),OVar16.ptr);
  }
  TwoPartyServer::TwoPartyServer((TwoPartyServer *)(local_240 + 0x38),&local_2e0);
  pCVar5 = local_2e0.hook.ptr;
  if (local_2e0.hook.ptr != (ClientHook *)0x0) {
    local_2e0.hook.ptr = (ClientHook *)0x0;
    (**(local_2e0.hook.disposer)->_vptr_Disposer)
              (local_2e0.hook.disposer,
               pCVar5->_vptr_ClientHook[-2] + (long)&pCVar5->_vptr_ClientHook);
  }
  pPVar10 = local_340.super_PromiseBase.node.ptr;
  if ((Disposer *)local_340.super_PromiseBase.node.ptr != (Disposer *)0x0) {
    local_340.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_340.super_PromiseBase.node.disposer._4_4_,
                         local_340.super_PromiseBase.node.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_340.super_PromiseBase.node.disposer._4_4_,
                        local_340.super_PromiseBase.node.disposer._0_4_),
               pPVar10->_vptr_PromiseNode[-2] + (long)&pPVar10->_vptr_PromiseNode);
  }
  puVar14 = (undefined8 *)(**(code **)(*local_290 + 0x18))();
  (**(code **)*puVar14)(&local_1c8,puVar14,"127.0.0.1",10,0);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::wait(&local_358,&local_1c8);
  CVar9.super_Connection._vptr_Connection =
       local_1c8.network.super_Connection.super_Connection._vptr_Connection;
  if (local_1c8.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_1c8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (**(code **)*(_func_int **)
                 local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase)
              (local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (long)CVar9.super_Connection._vptr_Connection +
               *(long *)(*(_func_int **)CVar9.super_Connection._vptr_Connection + -0x10));
  }
  (*(local_358.super_PromiseBase.node.ptr)->_vptr_PromiseNode[1])(&local_300);
  TwoPartyServer::listen((TwoPartyServer *)local_2d0,(int)local_240 + 0x38,(int)local_2f8);
  puVar14 = (undefined8 *)(**(code **)(*local_290 + 0x18))();
  iVar12 = (**(code **)(*local_2f8 + 8))();
  __n = (char *)0xa;
  (**(code **)*puVar14)(&local_340,puVar14,"127.0.0.1");
  kj::Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&local_1c8,&local_340);
  puVar14 = (undefined8 *)
            CONCAT44(local_358.super_PromiseBase.node.disposer._4_4_,
                     local_358.super_PromiseBase.node.disposer._0_4_);
  local_358.super_PromiseBase.node.disposer._0_4_ =
       local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase.
       _0_4_;
  local_358.super_PromiseBase.node.disposer._4_4_ =
       local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase.
       _4_4_;
  pPVar10 = (PromiseNode *)local_1c8.network.super_Connection.super_Connection._vptr_Connection;
  local_1c8.network.super_Connection.super_Connection._vptr_Connection =
       (Connection)(_func_int **)0x0;
  if (local_358.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    ppp_Var2 = &(local_358.super_PromiseBase.node.ptr)->_vptr_PromiseNode;
    ppp_Var3 = &(local_358.super_PromiseBase.node.ptr)->_vptr_PromiseNode;
    local_358.super_PromiseBase.node.ptr = pPVar10;
    (**(code **)*puVar14)(puVar14,(*ppp_Var2)[-2] + (long)ppp_Var3);
    pPVar10 = local_358.super_PromiseBase.node.ptr;
  }
  local_358.super_PromiseBase.node.ptr = pPVar10;
  CVar9.super_Connection._vptr_Connection =
       (Connection)(Connection)local_1c8.network.super_Connection;
  if (local_1c8.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_1c8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (**(code **)*(_func_int **)
                 local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase)
              (local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (long)CVar9.super_Connection._vptr_Connection +
               *(long *)(*(_func_int **)CVar9.super_Connection._vptr_Connection + -0x10));
  }
  pPVar10 = local_340.super_PromiseBase.node.ptr;
  if ((Disposer *)local_340.super_PromiseBase.node.ptr != (Disposer *)0x0) {
    local_340.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_340.super_PromiseBase.node.disposer._4_4_,
                         local_340.super_PromiseBase.node.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_340.super_PromiseBase.node.disposer._4_4_,
                        local_340.super_PromiseBase.node.disposer._0_4_),
               pPVar10->_vptr_PromiseNode[-2] + (long)&pPVar10->_vptr_PromiseNode);
  }
  (**(local_358.super_PromiseBase.node.ptr)->_vptr_PromiseNode)(&local_1c8);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::wait(&local_2f0,&local_1c8);
  CVar9.super_Connection._vptr_Connection =
       (Connection)(Connection)local_1c8.network.super_Connection;
  if (local_1c8.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_1c8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (**(code **)*(_func_int **)
                 local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase)
              (local_1c8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (long)CVar9.super_Connection._vptr_Connection +
               *(long *)(*(_func_int **)CVar9.super_Connection._vptr_Connection + -0x10));
  }
  TwoPartyClient::TwoPartyClient(&local_1c8,(AsyncIoStream *)local_2f0.super_PromiseBase.node.ptr);
  CVar17 = TwoPartyClient::bootstrap((TwoPartyClient *)local_240);
  (**(code **)(*(_func_int **)local_240._8_8_ + 0x20))(&local_340,local_240._8_8_,CVar17.hook.ptr);
  uVar6 = local_240._8_8_;
  local_2b8 = local_340.super_PromiseBase.node.disposer._0_4_;
  uStack_2b4 = local_340.super_PromiseBase.node.disposer._4_4_;
  pDStack_2b0 = (Disposer *)local_340.super_PromiseBase.node.ptr;
  local_2d0._16_8_ = &Capability::Client::typeinfo;
  if ((_func_int **)local_240._8_8_ != (_func_int **)0x0) {
    local_240._8_8_ = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_240._0_8_)
              (local_240._0_8_,uVar6 + *(long *)(*(_func_int **)uVar6 + -0x10));
  }
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_240,(Client *)(local_2d0 + 0x10),&local_28);
  *(undefined4 *)&((AsyncInputStream *)local_240._16_8_)->_vptr_AsyncInputStream = 0x7b;
  pbVar1 = (byte *)((long)&((AsyncInputStream *)local_240._16_8_)->_vptr_AsyncInputStream + 4);
  *pbVar1 = *pbVar1 | 1;
  pvVar15 = extraout_RDX;
  if ((local_344 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_340.super_PromiseBase.node.disposer._0_4_ = 0;
    __n = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
    iVar12 = 0x4c95ab;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x14e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_340,&local_344);
    pvVar15 = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_278,(int)local_240,pvVar15,(size_t)__n,iVar12);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_340,&local_278);
  pDVar7 = local_278.hook.disposer;
  uVar6 = local_278.super_Builder._builder._32_8_;
  if (local_278.super_Builder._builder._32_8_ != 0) {
    local_278.super_Builder._builder.dataSize = 0;
    local_278.super_Builder._builder.pointerCount = 0;
    local_278.super_Builder._builder._38_2_ = 0;
    local_278.hook.disposer = (Disposer *)0x0;
    (**(local_278.hook.ptr)->_vptr_RequestHook)(local_278.hook.ptr,uVar6,8,pDVar7,pDVar7,0);
  }
  pWVar8 = local_278.super_Builder._builder.pointers;
  if (local_278.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_278.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_278.super_Builder._builder.data)
              (local_278.super_Builder._builder.data,
               (long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
  }
  if (local_278.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_278.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_278.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )();
  }
  if (local_31c == 0) {
    uVar13 = 0x7fffffff;
    local_278.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    local_278.super_Builder._builder.data = (void *)0x0;
    local_278.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_278.super_Builder._builder.segment =
         (SegmentBuilder *)
         CONCAT44(local_340.super_PromiseBase.node.disposer._4_4_,
                  local_340.super_PromiseBase.node.disposer._0_4_);
    local_278.super_Builder._builder.capTable =
         (CapTableBuilder *)local_340.super_PromiseBase.node.ptr;
    local_278.super_Builder._builder.data = local_328;
    uVar13 = local_318;
  }
  local_278.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_278.super_Builder._builder.pointers._4_4_,uVar13);
  RVar18 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_278,(void *)0x0,0);
  pvVar11 = local_328;
  pvVar15 = local_278.super_Builder._builder.data;
  if (((RVar18.super_StringPtr.content.size_ != 4) ||
      (iVar12 = bcmp(RVar18.super_StringPtr.content.ptr,"foo",3),
      pvVar15 = local_278.super_Builder._builder.data, pvVar11 = local_328, iVar12 != 0)) &&
     (local_278.super_Builder._builder.data = pvVar11, kj::_::Debug::minSeverity < 3)) {
    if (local_31c == 0) {
      local_318 = 0x7fffffff;
      local_278.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      local_278.super_Builder._builder.data = (void *)0x0;
      local_278.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    }
    else {
      local_278.super_Builder._builder.segment =
           (SegmentBuilder *)
           CONCAT44(local_340.super_PromiseBase.node.disposer._4_4_,
                    local_340.super_PromiseBase.node.disposer._0_4_);
      local_278.super_Builder._builder.capTable =
           (CapTableBuilder *)local_340.super_PromiseBase.node.ptr;
    }
    local_278.super_Builder._builder.pointers._4_4_ =
         (undefined4)((ulong)local_278.super_Builder._builder.pointers >> 0x20);
    local_278.super_Builder._builder.pointers =
         (WirePointer *)CONCAT44(local_278.super_Builder._builder.pointers._4_4_,local_318);
    local_38 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_278,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x150,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4fa6a4,(Reader *)&local_38);
    pvVar15 = local_278.super_Builder._builder.data;
  }
  local_278.super_Builder._builder.data = pvVar15;
  if ((local_344 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_278.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_278.super_Builder._builder.segment._4_4_,1);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x151,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)&local_278,&local_344);
  }
  plVar4 = local_308;
  if (local_308 != (long *)0x0) {
    local_308 = (long *)0x0;
    (**(code **)*local_310)(local_310,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  uVar6 = local_240._48_8_;
  if ((RequestHook *)local_240._48_8_ != (RequestHook *)0x0) {
    local_240._48_8_ = (RequestHook *)0x0;
    (***(_func_int ***)local_240._40_8_)
              (local_240._40_8_,(*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6);
  }
  pDVar7 = pDStack_2b0;
  if (pDStack_2b0 != (Disposer *)0x0) {
    pDStack_2b0 = (Disposer *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_2b4,local_2b8))
              ((undefined8 *)CONCAT44(uStack_2b4,local_2b8),
               pDVar7->_vptr_Disposer[-2] + (long)&pDVar7->_vptr_Disposer);
  }
  RpcSystemBase::~RpcSystemBase(&local_1c8.rpcSystem.super_RpcSystemBase);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_1c8.network);
  pPVar10 = local_2f0.super_PromiseBase.node.ptr;
  if ((AsyncIoStream *)local_2f0.super_PromiseBase.node.ptr != (AsyncIoStream *)0x0) {
    local_2f0.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_2f0.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_2f0.super_PromiseBase.node.disposer,
               ((AsyncInputStream *)&pPVar10->_vptr_PromiseNode)->_vptr_AsyncInputStream[-2] +
               (long)&((AsyncInputStream *)&pPVar10->_vptr_PromiseNode)->_vptr_AsyncInputStream);
  }
  uVar6 = local_2d0._8_8_;
  if ((Disposer *)local_2d0._8_8_ != (Disposer *)0x0) {
    local_2d0._8_8_ = (Disposer *)0x0;
    (**(code **)*(_func_int **)local_2d0._0_8_)
              (local_2d0._0_8_,(*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6);
  }
  plVar4 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    local_2f8 = (long *)0x0;
    (**(code **)*local_300)(local_300,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  pPVar10 = local_358.super_PromiseBase.node.ptr;
  if (local_358.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_358.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_358.super_PromiseBase.node.disposer._4_4_,
                         local_358.super_PromiseBase.node.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_358.super_PromiseBase.node.disposer._4_4_,
                        local_358.super_PromiseBase.node.disposer._0_4_),
               (_func_int *)
               ((long)&pPVar10->_vptr_PromiseNode + (long)pPVar10->_vptr_PromiseNode[-2]));
  }
  local_240._56_8_ = &PTR_taskFailed_00646dc8;
  kj::TaskSet::~TaskSet(&local_1f0);
  plVar4 = local_1f8;
  if (local_1f8 != (long *)0x0) {
    local_1f8 = (long *)0x0;
    (**(code **)*local_200)(local_200,*(long *)(*plVar4 + -0x10) + (long)plVar4);
  }
  plVar4 = local_290;
  if (local_290 != (long *)0x0) {
    local_290 = (long *)0x0;
    (**local_298->_vptr_PromiseFulfiller)(local_298,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  pDVar7 = local_2a0;
  if (local_2a0 != (Disposer *)0x0) {
    local_2a0 = (Disposer *)0x0;
    (**(local_2a8->super_Event)._vptr_Event)
              (local_2a8,pDVar7->_vptr_Disposer[-2] + (long)&pDVar7->_vptr_Disposer);
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}